

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O1

void __thiscall
PFData_test_dist_press_Test::~PFData_test_dist_press_Test(PFData_test_dist_press_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(PFData_test, dist_press){
    char buf1[1024];
    char buf2[1024];

    PFData p1("tests/inputs/press.init.pfb");
    p1.loadHeader();
    p1.loadPQR();
    EXPECT_EQ(1, p1.getR());
    EXPECT_EQ(4, p1.getQ());
    EXPECT_EQ(4, p1.getP());
    EXPECT_EQ(16, p1.getNumSubgrids());


    PFData test("tests/inputs/press.init.pfb");
    test.distFile(2,2,1,"tests/press.init.pfb");

    EXPECT_EQ(4, test.getNumSubgrids());
    //Also test loadPQR
    PFData test2("tests/press.init.pfb");
    test2.loadHeader();
    test2.loadPQR();
    EXPECT_EQ(1, test2.getR());
    EXPECT_EQ(2, test2.getQ());
    EXPECT_EQ(2, test2.getP());
    EXPECT_EQ(4, test2.getNumSubgrids());

    FILE* f1 = fopen("tests/inputs/press.init.pfb","rb");
    FILE* f2 = fopen("tests/press.init.pfb","rb");
    ASSERT_NE(f1,nullptr);
    ASSERT_NE(f2,nullptr);
    int retval1 = fread(buf1,1,64,f1);
    int retval2 = fread(buf2,1,64,f2);
    EXPECT_EQ(retval1,retval2);
    int result = memcmp(buf1,buf2,62);
    EXPECT_EQ(0,result);
    result = memcmp(buf1,buf2,64);
    EXPECT_NE(0,result);
    fclose(f1);
    fclose(f2);
    ASSERT_EQ(0,remove("tests/press.init.pfb"));
}